

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> * __thiscall
dg::vr::StructureAnalyzer::possibleSources
          (vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>
           *__return_storage_ptr__,StructureAnalyzer *this,PHINode *phi,bool bval)

{
  VRCodeGraph *this_00;
  bool bVar1;
  Value *pVVar2;
  const_block_iterator ppBVar3;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  iVar4;
  VRLocation *pVVar5;
  Instruction *ptr;
  uint i;
  ulong uVar6;
  _Head_base<0UL,_dg::vr::VREdge_*,_false> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar6 = 0;
  do {
    if ((*(uint *)(phi + 0x14) & 0x7ffffff) <= uVar6) {
      return __return_storage_ptr__;
    }
    pVVar2 = llvm::PHINode::getOperand(phi,(uint)uVar6);
    if ((pVVar2 == (Value *)0x0) || (pVVar2[0x10] != (Value)0x10)) {
LAB_0013c3e9:
      ppBVar3 = llvm::PHINode::block_begin(phi);
      this_00 = *(VRCodeGraph **)(this + 8);
      iVar4 = std::
              prev<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,true>>
                        ((node_pointer)(ppBVar3[uVar6] + 0x28),1);
      iVar4 = std::
              prev<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,false,false,void>,false,true>>
                        (iVar4,1);
      ptr = (Instruction *)&iVar4.NodePtr[-2].super_node_base_type.Next;
      if (iVar4.NodePtr == (node_pointer)0x0) {
        ptr = (Instruction *)0x0;
      }
      pVVar5 = VRCodeGraph::getVRLocation(this_00,ptr);
      local_38._M_head_impl =
           *(VREdge **)
            &(((pVVar5->successors).
               super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
             super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t;
      std::vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>>::
      emplace_back<dg::vr::VREdge*>
                ((vector<dg::vr::VREdge_const*,std::allocator<dg::vr::VREdge_const*>> *)
                 __return_storage_ptr__,(VREdge **)&local_38);
    }
    else {
      bVar1 = llvm::APInt::isOne((APInt *)(pVVar2 + 0x18));
      if (bval && bVar1) goto LAB_0013c3e9;
      bVar1 = llvm::APInt::isZero((APInt *)(pVVar2 + 0x18));
      if (bVar1 && !bval) goto LAB_0013c3e9;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

std::vector<const VREdge *>
StructureAnalyzer::possibleSources(const llvm::PHINode *phi, bool bval) const {
    std::vector<const VREdge *> result;
    for (unsigned i = 0; i < phi->getNumIncomingValues(); ++i) {
        const llvm::Value *val = phi->getIncomingValue(i);
        const auto *cVal = llvm::dyn_cast<llvm::ConstantInt>(val);

        if (!cVal || (cVal->isOne() && bval) || (cVal->isZero() && !bval)) {
            const auto *block = phi->getIncomingBlock(i);
            const VRLocation &end = codeGraph.getVRLocation(
                    &*std::prev(std::prev(block->end())));
            assert(end.succsSize() == 1);
            result.emplace_back(end.getSuccEdge(0));
        }
    }
    return result;
}